

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall icu_63::AnnualTimeZoneRule::operator==(AnnualTimeZoneRule *this,TimeZoneRule *that)

{
  bool bVar1;
  UBool UVar2;
  
  if (this == (AnnualTimeZoneRule *)that) {
    return '\x01';
  }
  bVar1 = std::type_info::operator!=
                    ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if (((!bVar1) &&
      (UVar2 = DateTimeRule::operator==
                         (this->fDateTimeRule,(DateTimeRule *)that[1].super_UObject._vptr_UObject),
      UVar2 != '\0')) &&
     (this->fStartYear == *(int *)&that[1].fName.super_Replaceable.super_UObject._vptr_UObject)) {
    return this->fEndYear ==
           *(int *)((long)&that[1].fName.super_Replaceable.super_UObject._vptr_UObject + 4);
  }
  return '\0';
}

Assistant:

UBool
AnnualTimeZoneRule::operator==(const TimeZoneRule& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    AnnualTimeZoneRule *atzr = (AnnualTimeZoneRule*)&that;
    return (*fDateTimeRule == *(atzr->fDateTimeRule) &&
            fStartYear == atzr->fStartYear &&
            fEndYear == atzr->fEndYear);
}